

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O1

Type * __thiscall slang::ast::MultiPortSymbol::getType(MultiPortSymbol *this)

{
  Scope *pSVar1;
  SyntaxNode *this_00;
  Compilation *this_01;
  size_t sVar2;
  pointer ppPVar3;
  PortSymbol *this_02;
  bitmask<slang::ast::IntegralFlags> flags;
  bool bVar4;
  bitwidth_t bVar5;
  Type *this_03;
  Diagnostic *diag;
  underlying_type uVar6;
  long lVar7;
  bool bVar8;
  LookupLocation LVar9;
  SourceRange range;
  ASTContext context;
  bitwidth_t local_8c;
  Type *local_80;
  ASTContext local_68;
  
  if (this->type != (Type *)0x0) {
    return this->type;
  }
  pSVar1 = (this->super_Symbol).parentScope;
  this_00 = (this->super_Symbol).originatingSyntax;
  this_01 = pSVar1->compilation;
  LVar9 = LookupLocation::before(&this->super_Symbol);
  local_68.lookupIndex = LVar9.index;
  local_68.flags.m_bits = 0x20;
  local_68.instanceOrProc = (Symbol *)0x0;
  local_68.firstTempVar = (TempVarSymbol *)0x0;
  local_68.randomizeDetails = (RandomizeDetails *)0x0;
  local_68.assertionInstance = (AssertionInstanceDetails *)0x0;
  sVar2 = (this->ports)._M_extent._M_extent_value;
  bVar8 = sVar2 == 0;
  local_68.scope.ptr = pSVar1;
  if (bVar8) {
    flags.m_bits = '\0';
    local_8c = 0;
  }
  else {
    ppPVar3 = (this->ports)._M_ptr;
    lVar7 = 0;
    local_8c = 0;
    flags.m_bits = '\0';
    do {
      this_02 = *(PortSymbol **)((long)ppPVar3 + lVar7);
      this_03 = PortSymbol::getType(this_02);
      if (this_03->canonical == (Type *)0x0) {
        Type::resolveCanonical(this_03);
      }
      if (((this_03->canonical->super_Symbol).kind == ErrorType) ||
         ((this_03->canonical->super_Symbol).kind == UntypedType)) {
LAB_00308b46:
        local_80 = this_01->errorType;
        this->type = local_80;
        bVar4 = false;
      }
      else {
        bVar4 = Type::isIntegral(this_03);
        if (!bVar4) {
          diag = ASTContext::addDiag(&local_68,(DiagCode)0x210007,this_02->externalLoc);
          ast::operator<<(diag,this_03);
          goto LAB_00308b46;
        }
        bVar5 = Type::getBitWidth(this_03);
        local_8c = local_8c + bVar5;
        range = slang::syntax::SyntaxNode::sourceRange(this_00);
        bVar4 = ASTContext::requireValidBitWidth(&local_68,local_8c,range);
        if (!bVar4) goto LAB_00308b46;
        bVar4 = Type::isFourState(this_03);
        uVar6 = '\x02';
        if (!bVar4) {
          uVar6 = flags.m_bits;
        }
        bVar4 = true;
        flags.m_bits = uVar6;
      }
      if (!bVar4) break;
      lVar7 = lVar7 + 8;
      bVar8 = sVar2 << 3 == lVar7;
    } while (!bVar8);
  }
  if (bVar8) {
    if (local_8c == 0) {
      local_80 = this_01->errorType;
    }
    else {
      local_80 = Compilation::getType(this_01,local_8c,flags);
    }
    this->type = local_80;
  }
  return local_80;
}

Assistant:

const Type& MultiPortSymbol::getType() const {
    if (type)
        return *type;

    auto scope = getParentScope();
    auto syntax = getSyntax();
    SLANG_ASSERT(scope && syntax);

    auto& comp = scope->getCompilation();

    ASTContext context(*scope, LookupLocation::before(*this), ASTFlags::NonProcedural);
    bitwidth_t totalWidth = 0;
    bitmask<IntegralFlags> flags;

    for (auto port : ports) {
        auto& t = port->getType();
        if (t.isError() || t.isUntypedType()) {
            type = &comp.getErrorType();
            return *type;
        }

        if (!t.isIntegral()) {
            context.addDiag(diag::BadConcatExpression, port->externalLoc) << t;
            type = &comp.getErrorType();
            return *type;
        }

        totalWidth += t.getBitWidth();

        if (!context.requireValidBitWidth(totalWidth, syntax->sourceRange())) {
            type = &comp.getErrorType();
            return *type;
        }

        if (t.isFourState())
            flags |= IntegralFlags::FourState;
    }

    if (totalWidth == 0) {
        type = &comp.getErrorType();
        return *type;
    }

    type = &comp.getType(totalWidth, flags);
    return *type;
}